

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O1

ChStreamOutBinary * __thiscall
chrono::ChStreamOutBinary::operator<<(ChStreamOutBinary *this,unsigned_long_long Val)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  long lVar3;
  unsigned_long_long tmp;
  undefined8 local_18;
  unsigned_long_long local_10;
  
  local_10 = Val;
  if ((this->super_ChBinaryArchive).big_endian_machine == true) {
    puVar2 = (undefined1 *)((long)&local_18 + 7);
    local_18 = Val;
    lVar3 = 0;
    do {
      uVar1 = *(undefined1 *)((long)&local_18 + lVar3);
      *(undefined1 *)((long)&local_18 + lVar3) = *puVar2;
      *puVar2 = uVar1;
      lVar3 = lVar3 + 1;
      puVar2 = puVar2 + -1;
    } while (lVar3 != 4);
    (*(this->super_ChStreamOut)._vptr_ChStreamOut[2])(this,&local_18,8);
  }
  (*(this->super_ChStreamOut)._vptr_ChStreamOut[2])(this,&local_10,8);
  return this;
}

Assistant:

ChStreamOutBinary& ChStreamOutBinary::operator<<(unsigned long long Val) {
    if (big_endian_machine) {
        unsigned long long tmp = Val;
        StreamSwapBytes<unsigned long long>(&tmp);
        this->Output((char*)&tmp, sizeof(unsigned long long));
    }
    this->Output((char*)&Val, sizeof(unsigned long long));
    return (*this);
}